

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::debug_print(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
              *this,AST_Node *t,string *prepend)

{
  AST_Node *t_00;
  ostream *poVar1;
  pointer prVar2;
  _Vector_base<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)prepend);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::operator<<(poVar1,&DAT_0024aa88 +
                                  *(int *)(&DAT_0024aa88 + (long)(int)t->identifier * 4));
  poVar1 = std::operator<<(poVar1,") ");
  poVar1 = std::operator<<(poVar1,(string *)&t->text);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(t->location).start.line);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(t->location).start.column);
  std::operator<<(poVar1,'\n');
  (**t->_vptr_AST_Node)(&local_68,t);
  for (prVar2 = local_68._M_impl.super__Vector_impl_data._M_start;
      prVar2 != local_68._M_impl.super__Vector_impl_data._M_finish; prVar2 = prVar2 + 1) {
    t_00 = prVar2->_M_data;
    std::operator+(&local_50,prepend,"  ");
    debug_print(this,t_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::
  _Vector_base<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  ::~_Vector_base(&local_68);
  return;
}

Assistant:

void debug_print(const AST_Node &t, std::string prepend = "") const override {
        std::cout << prepend << "(" << ast_node_type_to_string(t.identifier) << ") " << t.text << " : " << t.start().line << ", "
                  << t.start().column << '\n';
        for (const auto &node : t.get_children()) {
          debug_print(node.get(), prepend + "  ");
        }
      }